

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeSet::_toPattern(UnicodeSet *this,UnicodeString *result,UBool escapeUnprintable)

{
  char16_t cVar1;
  short sVar2;
  UBool UVar3;
  UnicodeString *pUVar4;
  uint uVar5;
  __off_t __length;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint c;
  
  if (this->pat == (char16_t *)0x0) {
    pUVar4 = _generatePattern(this,result,escapeUnprintable);
    return pUVar4;
  }
  iVar8 = 0;
  do {
    uVar7 = 0;
    while( true ) {
      if (this->patLen <= iVar8) {
        return result;
      }
      iVar6 = iVar8 + 1;
      cVar1 = this->pat[iVar8];
      c = (uint)(ushort)cVar1;
      if ((iVar6 != this->patLen && (c & 0xfc00) == 0xd800) &&
         (uVar5 = (uint)(ushort)this->pat[iVar6], (uVar5 & 0xfc00) == 0xdc00)) {
        c = (uint)(ushort)cVar1 * 0x400 + uVar5 + 0xfca02400;
        iVar6 = iVar8 + 2;
      }
      iVar8 = iVar6;
      if ((escapeUnprintable != '\0') && (UVar3 = ICU_Utility::isUnprintable(c), UVar3 != '\0'))
      break;
      UnicodeString::append(result,c);
      uVar7 = uVar7 + 1;
      if (c != 0x5c) {
        uVar7 = 0;
      }
    }
    if ((uVar7 & 0x80000001) == 1) {
      sVar2 = (result->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar6 = (result->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)sVar2 >> 5;
      }
      UnicodeString::truncate(result,(char *)(ulong)(iVar6 - 1),__length);
    }
    ICU_Utility::escapeUnprintable(result,c);
  } while( true );
}

Assistant:

UnicodeString& UnicodeSet::_toPattern(UnicodeString& result,
                                      UBool escapeUnprintable) const
{
    if (pat != NULL) {
        int32_t i;
        int32_t backslashCount = 0;
        for (i=0; i<patLen; ) {
            UChar32 c;
            U16_NEXT(pat, i, patLen, c);
            if (escapeUnprintable && ICU_Utility::isUnprintable(c)) {
                // If the unprintable character is preceded by an odd
                // number of backslashes, then it has been escaped.
                // Before unescaping it, we delete the final
                // backslash.
                if ((backslashCount % 2) == 1) {
                    result.truncate(result.length() - 1);
                }
                ICU_Utility::escapeUnprintable(result, c);
                backslashCount = 0;
            } else {
                result.append(c);
                if (c == BACKSLASH) {
                    ++backslashCount;
                } else {
                    backslashCount = 0;
                }
            }
        }
        return result;
    }

    return _generatePattern(result, escapeUnprintable);
}